

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node_struct *
pugi::impl::anon_unknown_0::append_new_node
          (xml_node_struct *node,xml_allocator *alloc,xml_node_type type)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_memory_page *in_RAX;
  xml_node_struct *pxVar4;
  xml_memory_page *local_18;
  
  uVar1 = alloc->_busy_size + 0x40;
  if (uVar1 < 0x7fd9) {
    local_18 = alloc->_root;
    pxVar4 = (xml_node_struct *)((long)&local_18[1].allocator + alloc->_busy_size);
    alloc->_busy_size = uVar1;
  }
  else {
    local_18 = in_RAX;
    pxVar4 = (xml_node_struct *)xml_allocator::allocate_memory_oob(alloc,0x40,&local_18);
    if (pxVar4 == (xml_node_struct *)0x0) {
      return (xml_node_struct *)0x0;
    }
  }
  pxVar4->prev_sibling_c = (xml_node_struct *)0x0;
  pxVar4->next_sibling = (xml_node_struct *)0x0;
  pxVar4->parent = (xml_node_struct *)0x0;
  pxVar4->first_child = (xml_node_struct *)0x0;
  pxVar4->name = (char_t *)0x0;
  pxVar4->value = (char_t *)0x0;
  pxVar4->first_attribute = (xml_attribute_struct *)0x0;
  pxVar4->header = (ulong)type | ((long)pxVar4 - (long)local_18) * 0x100;
  pxVar4->parent = node;
  pxVar2 = node->first_child;
  if (pxVar2 == (xml_node_struct *)0x0) {
    node->first_child = pxVar4;
    pxVar2 = pxVar4;
  }
  else {
    pxVar3 = pxVar2->prev_sibling_c;
    pxVar3->next_sibling = pxVar4;
    pxVar4->prev_sibling_c = pxVar3;
  }
  pxVar2->prev_sibling_c = pxVar4;
  return pxVar4;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE xml_node_struct* append_new_node(xml_node_struct* node, xml_allocator& alloc, xml_node_type type = node_element)
	{
		if (!alloc.reserve()) return NULL;

		xml_node_struct* child = allocate_node(alloc, type);
		if (!child) return NULL;

		append_node(child, node);

		return child;
	}